

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O0

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters
          (KotlinGenerator *this,StructDef *struct_def,CodeWriter *writer)

{
  KotlinGenerator *this_00;
  Definition *pDVar1;
  pointer ppFVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  StructDef *pSVar5;
  EnumDef *pEVar6;
  bool bVar7;
  bool bVar8;
  reference ppFVar9;
  size_t t;
  FieldDef *field_00;
  bool local_108b;
  bool local_108a;
  unsigned_long local_ff0;
  anon_class_24_3_5f35eaae local_e70;
  function<void_()> local_e58;
  allocator<char> local_e31;
  string local_e30;
  allocator<char> local_e09;
  string local_e08;
  allocator<char> local_de1;
  string local_de0;
  function<void_()> local_dc0;
  allocator<char> local_d99;
  string local_d98;
  function<void_()> local_d78;
  allocator<char> local_d51;
  string local_d50;
  undefined1 local_d30 [8];
  anon_class_64_8_846b8abb statements;
  allocator<char> local_cc9;
  undefined1 local_cc8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> setter_index;
  string local_ca0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c80;
  undefined1 local_c60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> setter_parameter;
  string local_c20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c00;
  undefined1 local_be0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_2;
  string size;
  string local_b98;
  allocator<char> local_b71;
  string local_b70;
  undefined1 local_b50 [8];
  string name_1;
  Type underlying_type;
  Type value_type;
  function<void_()> local_ae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa0;
  anon_class_24_3_47cc0641 local_a80;
  function<void_()> local_a68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a28;
  undefined1 local_a08 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> nested_method_name;
  string local_9e0;
  undefined1 local_9c0 [8];
  string nested_type_name;
  function<void_()> local_990;
  allocator<char> local_969;
  string local_968;
  allocator<char> local_941;
  string local_940;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  anon_class_16_2_a89c3491 local_900;
  function<void_()> local_8f0;
  allocator<char> local_8c9;
  string local_8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  Type local_888;
  undefined1 local_868 [8];
  string end_idx;
  anon_class_24_3_aa68e553 local_828;
  function<void_()> local_810;
  string local_7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  undefined1 local_790 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> param2;
  function<void_()> local_758;
  undefined1 local_738 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rtype;
  undefined1 local_6f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_1;
  string local_6d0;
  undefined1 local_6b0 [8];
  string name;
  string local_688;
  undefined1 local_668 [8];
  string qualified_name;
  FieldDef *kfield;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_638;
  iterator kit;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *fields;
  StructDef *sd;
  string *local_618;
  function<void_()> local_610;
  allocator<char> local_5e9;
  string local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  anon_class_24_3_8247fe50 local_5a8;
  function<void_()> local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  anon_class_32_4_f5627902 local_550;
  function<void_()> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  allocator<char> local_4c9;
  undefined1 local_4c8 [8];
  string params;
  Type vectortype;
  function<void_()> local_478;
  anon_class_24_3_3a33afe5 local_458;
  function<void_()> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  anon_class_8_1_72ac95b1 local_400;
  function<void_()> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  anon_class_8_1_72ac95b1 local_3b8;
  function<void_()> local_3b0;
  anon_class_8_1_72ac95b1 local_390;
  function<void_()> local_388;
  anon_class_8_1_72ac95b1 local_368;
  function<void_()> local_360;
  allocator<char> local_339;
  string local_338;
  anon_class_8_1_72ac95b1 local_318;
  function<void_()> local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  Escape local_1b4;
  undefined1 local_1b0 [4];
  BaseType value_base_type;
  undefined1 local_190 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> offset_prefix;
  string offset_val;
  string ucast;
  string local_128;
  undefined1 local_108 [8];
  string bbgetter;
  string return_type;
  string field_default_value;
  string field_type;
  string field_name;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_48;
  iterator it;
  FieldDef *key_field;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> fields_vec;
  CodeWriter *writer_local;
  StructDef *struct_def_local;
  KotlinGenerator *this_local;
  
  fields_vec.super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)writer;
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::vector
            ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)&key_field
             ,&(struct_def->fields).vec);
  it._M_current = (FieldDef **)0x0;
  local_48._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                  &key_field);
  do {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                       &key_field);
    bVar7 = __gnu_cxx::operator!=
                      (&local_48,
                       (__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    ppFVar2 = fields_vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (!bVar7) {
      if (((struct_def->has_key & 1U) != 0) && ((struct_def->fixed & 1U) == 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_de0,"keysCompare",&local_de1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e08,"o1: Int, o2: Int, _bb: ByteBuffer",&local_e09);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_e30,"Int",&local_e31);
        local_e70.key_field = (FieldDef **)&it;
        local_e70.writer =
             (CodeWriter *)
             fields_vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_e70.this = this;
        std::function<void()>::
        function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_18_,void>
                  ((function<void()> *)&local_e58,&local_e70);
        GenerateOverrideFun((CodeWriter *)ppFVar2,&local_de0,&local_e08,&local_e30,&local_e58);
        std::function<void_()>::~function(&local_e58);
        std::__cxx11::string::~string((string *)&local_e30);
        std::allocator<char>::~allocator(&local_e31);
        std::__cxx11::string::~string((string *)&local_e08);
        std::allocator<char>::~allocator(&local_e09);
        std::__cxx11::string::~string((string *)&local_de0);
        std::allocator<char>::~allocator(&local_de1);
      }
      std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::~vector
                ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                 &key_field);
      return;
    }
    ppFVar9 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_48);
    this_00 = (KotlinGenerator *)*ppFVar9;
    if (((byte)(this_00->namer_).super_Namer.config_.object_suffix._M_dataplus & 1) == 0) {
      if (((this_00->namer_).super_Namer.config_.object_suffix.field_0x1 & 1) != 0) {
        it._M_current = (FieldDef **)this_00;
      }
      GenerateComment(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&(this_00->super_BaseGenerator).qualifying_separator_,
                      (CodeWriter *)
                      fields_vec.
                      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (CommentConfig *)(anonymous_namespace)::comment_config);
      IdlNamer::Field_abi_cxx11_
                ((string *)((long)&field_type.field_2 + 8),&this->namer_,(FieldDef *)this_00);
      GenTypeGet_abi_cxx11_
                ((string *)((long)&field_default_value.field_2 + 8),this,
                 (Type *)&(this_00->namer_).super_Namer.config_.escape_keywords);
      GenDefaultValue_abi_cxx11_
                ((string *)((long)&return_type.field_2 + 8),this,(FieldDef *)this_00,false);
      GetterReturnType_abi_cxx11_((string *)((long)&bbgetter.field_2 + 8),this,(FieldDef *)this_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,"bb",(allocator<char> *)(ucast.field_2._M_local_buf + 0xf));
      ByteBufferGetter((string *)local_108,this,
                       (Type *)&(this_00->namer_).super_Namer.config_.escape_keywords,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator((allocator<char> *)(ucast.field_2._M_local_buf + 0xf));
      CastToUsigned_abi_cxx11_((string *)((long)&offset_val.field_2 + 8),this_00,field_00);
      NumToString<unsigned_short>
                ((string *)((long)&offset_prefix.field_2 + 8),
                 *(unsigned_short *)
                  ((long)&(this_00->namer_).super_Namer.config_.object_prefix.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                     "val o = __offset(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&offset_prefix.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                     "); return o != 0 ? ");
      std::__cxx11::string::~string((string *)local_1b0);
      ppFVar2 = fields_vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1b4 = (this_00->namer_).super_Namer.config_.escape_keywords;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"offset",&local_1d9);
      NumToString<unsigned_short>
                (&local_200,
                 *(unsigned_short *)
                  ((long)&(this_00->namer_).super_Namer.config_.object_prefix.field_2 + 8));
      CodeWriter::SetValue((CodeWriter *)ppFVar2,&local_1d8,&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator(&local_1d9);
      ppFVar2 = fields_vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_220,"return_type",&local_221);
      CodeWriter::SetValue((CodeWriter *)ppFVar2,&local_220,(string *)((long)&bbgetter.field_2 + 8))
      ;
      std::__cxx11::string::~string((string *)&local_220);
      std::allocator<char>::~allocator(&local_221);
      ppFVar2 = fields_vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_248,"field_type",&local_249);
      CodeWriter::SetValue
                ((CodeWriter *)ppFVar2,&local_248,(string *)((long)&field_default_value.field_2 + 8)
                );
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator(&local_249);
      ppFVar2 = fields_vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,"field_name",&local_271);
      CodeWriter::SetValue
                ((CodeWriter *)ppFVar2,&local_270,(string *)((long)&field_type.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_270);
      std::allocator<char>::~allocator(&local_271);
      ppFVar2 = fields_vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_298,"field_default",&local_299);
      CodeWriter::SetValue
                ((CodeWriter *)ppFVar2,&local_298,(string *)((long)&return_type.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_298);
      std::allocator<char>::~allocator(&local_299);
      ppFVar2 = fields_vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"bbgetter",&local_2c1)
      ;
      CodeWriter::SetValue((CodeWriter *)ppFVar2,&local_2c0,(string *)local_108);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::allocator<char>::~allocator(&local_2c1);
      ppFVar2 = fields_vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"ucast",&local_2e9);
      CodeWriter::SetValue
                ((CodeWriter *)ppFVar2,&local_2e8,(string *)((long)&offset_val.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_2e8);
      std::allocator<char>::~allocator(&local_2e9);
      ppFVar2 = fields_vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_1b4 == 0xf) {
        local_318.writer =
             (CodeWriter *)
             fields_vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::function<void()>::
        function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_1_,void>
                  ((function<void()> *)&local_310,&local_318);
        GenerateGetterOneLine
                  ((CodeWriter *)ppFVar2,(string *)((long)&field_type.field_2 + 8),
                   (string *)((long)&bbgetter.field_2 + 8),&local_310);
        std::function<void_()>::~function(&local_310);
      }
      else if ((local_1b4 == 0xe) &&
              ((this_00->namer_).super_Namer.config_.namespaces == (kKeep|kDasher))) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"j: Int",&local_339)
        ;
        local_368.writer =
             (CodeWriter *)
             fields_vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::function<void()>::
        function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_2_,void>
                  ((function<void()> *)&local_360,&local_368);
        GenerateFunOneLine((CodeWriter *)ppFVar2,(string *)((long)&field_type.field_2 + 8),
                           &local_338,(string *)((long)&bbgetter.field_2 + 8),&local_360,false);
        std::function<void_()>::~function(&local_360);
        std::__cxx11::string::~string((string *)&local_338);
        std::allocator<char>::~allocator(&local_339);
      }
      bVar7 = IsScalar(local_1b4);
      ppFVar2 = fields_vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (bVar7) {
        if ((struct_def->fixed & 1U) == 0) {
          local_3b8.writer =
               (CodeWriter *)
               fields_vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::function<void()>::
          function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_4_,void>
                    ((function<void()> *)&local_3b0,&local_3b8);
          GenerateGetter((CodeWriter *)ppFVar2,(string *)((long)&field_type.field_2 + 8),
                         (string *)((long)&bbgetter.field_2 + 8),&local_3b0);
          std::function<void_()>::~function(&local_3b0);
        }
        else {
          local_390.writer =
               (CodeWriter *)
               fields_vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::function<void()>::
          function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_3_,void>
                    ((function<void()> *)&local_388,&local_390);
          GenerateGetterOneLine
                    ((CodeWriter *)ppFVar2,(string *)((long)&field_type.field_2 + 8),
                     (string *)((long)&bbgetter.field_2 + 8),&local_388);
          std::function<void_()>::~function(&local_388);
        }
      }
      else {
        switch(local_1b4) {
        case 0xd:
          vectortype._24_8_ =
               fields_vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::function<void()>::
          function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_7_,void>
                    ((function<void()> *)&local_478,
                     (anon_class_16_2_32008a72 *)&vectortype.fixed_length);
          GenerateGetter((CodeWriter *)ppFVar2,(string *)((long)&field_type.field_2 + 8),
                         (string *)((long)&bbgetter.field_2 + 8),&local_478);
          std::function<void_()>::~function(&local_478);
          break;
        case 0xe:
          Type::VectorType((Type *)((long)&params.field_2 + 8),
                           (Type *)&(this_00->namer_).super_Namer.config_.escape_keywords);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_4c8,"j: Int",&local_4c9);
          std::allocator<char>::~allocator(&local_4c9);
          if ((params.field_2._8_4_ == 0xf) || (params.field_2._8_4_ == 0x10)) {
            std::operator+(&local_510,"obj: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&field_default_value.field_2 + 8));
            std::operator+(&local_4f0,&local_510,", j: Int");
            std::__cxx11::string::operator=((string *)local_4c8,(string *)&local_4f0);
            std::__cxx11::string::~string((string *)&local_4f0);
            std::__cxx11::string::~string((string *)&local_510);
          }
          ppFVar2 = fields_vec.
                    super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_550.vectortype = (Type *)((long)&params.field_2 + 8);
          local_550.writer =
               (CodeWriter *)
               fields_vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_550.offset_val = (string *)((long)&offset_prefix.field_2 + 8);
          local_550.field = (FieldDef *)this_00;
          std::function<void()>::
          function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_8_,void>
                    ((function<void()> *)&local_530,&local_550);
          GenerateFun((CodeWriter *)ppFVar2,(string *)((long)&field_type.field_2 + 8),
                      (string *)local_4c8,(string *)((long)&bbgetter.field_2 + 8),&local_530,false);
          std::function<void_()>::~function(&local_530);
          std::__cxx11::string::~string((string *)local_4c8);
          break;
        case 0xf:
          if ((struct_def->fixed & 1U) == 0) {
            std::operator+(&local_420,"obj: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&field_default_value.field_2 + 8));
            local_458.writer =
                 (CodeWriter *)
                 fields_vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_458.offset_val = (string *)((long)&offset_prefix.field_2 + 8);
            local_458.field = (FieldDef *)this_00;
            std::function<void()>::
            function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_6_,void>
                      ((function<void()> *)&local_440,&local_458);
            GenerateFun((CodeWriter *)ppFVar2,(string *)((long)&field_type.field_2 + 8),&local_420,
                        (string *)((long)&bbgetter.field_2 + 8),&local_440,false);
            std::function<void_()>::~function(&local_440);
            std::__cxx11::string::~string((string *)&local_420);
          }
          else {
            std::operator+(&local_3d8,"obj: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&field_default_value.field_2 + 8));
            local_400.writer =
                 (CodeWriter *)
                 fields_vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::function<void()>::
            function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_5_,void>
                      ((function<void()> *)&local_3f8,&local_400);
            GenerateFunOneLine((CodeWriter *)ppFVar2,(string *)((long)&field_type.field_2 + 8),
                               &local_3d8,(string *)((long)&bbgetter.field_2 + 8),&local_3f8,false);
            std::function<void_()>::~function(&local_3f8);
            std::__cxx11::string::~string((string *)&local_3d8);
          }
          break;
        case 0x10:
          std::operator+(&local_570,"obj: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_default_value.field_2 + 8));
          local_5a8.writer =
               (CodeWriter *)
               fields_vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_5a8.offset_val = (string *)((long)&offset_prefix.field_2 + 8);
          local_5a8.bbgetter = (string *)local_108;
          std::function<void()>::
          function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_9_,void>
                    ((function<void()> *)&local_590,&local_5a8);
          GenerateFun((CodeWriter *)ppFVar2,(string *)((long)&field_type.field_2 + 8),&local_570,
                      (string *)((long)&bbgetter.field_2 + 8),&local_590,false);
          std::function<void_()>::~function(&local_590);
          std::__cxx11::string::~string((string *)&local_570);
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp"
                        ,0x454,
                        "void flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(StructDef &, CodeWriter &) const"
                       );
        }
      }
      ppFVar2 = fields_vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_1b4 == 0xe) {
        std::operator+(&local_5c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&field_type.field_2 + 8),"Length");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e8,"Int",&local_5e9);
        sd = (StructDef *)
             fields_vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_618 = (string *)((long)&offset_prefix.field_2 + 8);
        std::function<void()>::
        function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_10_,void>
                  ((function<void()> *)&local_610,(anon_class_16_2_97156e7b *)&sd);
        GenerateGetter((CodeWriter *)ppFVar2,&local_5c8,&local_5e8,&local_610);
        std::function<void_()>::~function(&local_610);
        std::__cxx11::string::~string((string *)&local_5e8);
        std::allocator<char>::~allocator(&local_5e9);
        std::__cxx11::string::~string((string *)&local_5c8);
        if (((this_00->namer_).super_Namer.config_.namespaces == (kKeep|kDasher)) &&
           ((*(byte *)(*(long *)&(this_00->namer_).super_Namer.config_.namespace_seperator + 0x110)
            & 1) == 0)) {
          pDVar1 = *(Definition **)&(this_00->namer_).super_Namer.config_.namespace_seperator;
          kit._M_current = (FieldDef **)&pDVar1[1].file.field_2;
          local_638._M_current =
               (FieldDef **)
               std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                         ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                           *)kit._M_current);
          while( true ) {
            kfield = (FieldDef *)
                     std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                     ::end((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                            *)kit._M_current);
            bVar7 = __gnu_cxx::operator!=
                              (&local_638,
                               (__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                                *)&kfield);
            if (!bVar7) break;
            ppFVar9 = __gnu_cxx::
                      __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                      ::operator*(&local_638);
            qualified_name.field_2._8_8_ = *ppFVar9;
            if ((((FieldDef *)qualified_name.field_2._8_8_)->key & 1U) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_688,"",
                         (allocator<char> *)(name.field_2._M_local_buf + 0xf));
              BaseGenerator::WrapInNameSpace
                        ((string *)local_668,&this->super_BaseGenerator,pDVar1,&local_688);
              std::__cxx11::string::~string((string *)&local_688);
              std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf))
              ;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_6d0,"ByKey",
                         (allocator<char> *)(params_1.field_2._M_local_buf + 0xf));
              IdlNamer::Method((string *)local_6b0,&this->namer_,(FieldDef *)this_00,&local_6d0);
              std::__cxx11::string::~string((string *)&local_6d0);
              std::allocator<char>::~allocator
                        ((allocator<char> *)(params_1.field_2._M_local_buf + 0xf));
              GenTypeGet_abi_cxx11_
                        ((string *)((long)&rtype.field_2 + 8),this,
                         (Type *)(qualified_name.field_2._8_8_ + 200));
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_6f8,"key: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&rtype.field_2 + 8));
              std::__cxx11::string::~string((string *)(rtype.field_2._M_local_buf + 8));
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_738,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_668,"?");
              ppFVar2 = fields_vec.
                        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              param2.field_2._8_8_ =
                   fields_vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              std::function<void()>::
              function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_11_,void>
                        ((function<void()> *)&local_758,
                         (anon_class_24_3_aa68e553 *)((long)&param2.field_2 + 8));
              GenerateFun((CodeWriter *)ppFVar2,(string *)local_6b0,(string *)local_6f8,
                          (string *)local_738,&local_758,false);
              std::function<void_()>::~function(&local_758);
              std::operator+(&local_7d0,"obj: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_668);
              std::operator+(&local_7b0,&local_7d0,", key: ");
              GenTypeGet_abi_cxx11_(&local_7f0,this,(Type *)(qualified_name.field_2._8_8_ + 200));
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_790,&local_7b0,&local_7f0);
              std::__cxx11::string::~string((string *)&local_7f0);
              std::__cxx11::string::~string((string *)&local_7b0);
              std::__cxx11::string::~string((string *)&local_7d0);
              ppFVar2 = fields_vec.
                        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_828.writer =
                   (CodeWriter *)
                   fields_vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_828.offset_val = (string *)((long)&offset_prefix.field_2 + 8);
              local_828.qualified_name = (string *)local_668;
              std::function<void()>::
              function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_12_,void>
                        ((function<void()> *)&local_810,&local_828);
              GenerateFun((CodeWriter *)ppFVar2,(string *)local_6b0,(string *)local_790,
                          (string *)local_738,&local_810,false);
              std::function<void_()>::~function(&local_810);
              std::__cxx11::string::~string((string *)local_790);
              std::__cxx11::string::~string((string *)local_738);
              std::__cxx11::string::~string((string *)local_6f8);
              std::__cxx11::string::~string((string *)local_6b0);
              std::__cxx11::string::~string((string *)local_668);
              break;
            }
            __gnu_cxx::
            __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
            ::operator++(&local_638);
          }
        }
      }
      if (local_1b4 == 0xe) {
        Type::VectorType((Type *)((long)&end_idx.field_2 + 8),
                         (Type *)&(this_00->namer_).super_Namer.config_.escape_keywords);
        bVar8 = IsScalar(end_idx.field_2._8_4_);
        bVar7 = true;
        if (!bVar8) goto LAB_002506bd;
      }
      else {
LAB_002506bd:
        bVar7 = local_1b4 == 0xd;
      }
      if (bVar7) {
        if (local_1b4 == 0xd) {
          local_ff0 = 1;
        }
        else {
          Type::VectorType(&local_888,(Type *)&(this_00->namer_).super_Namer.config_.escape_keywords
                          );
          local_ff0 = InlineSize(&local_888);
        }
        NumToString<unsigned_long>((string *)local_868,local_ff0);
        ppFVar2 = fields_vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::operator+(&local_8a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&field_type.field_2 + 8),"AsByteBuffer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8c8,"ByteBuffer",&local_8c9);
        local_900.writer =
             (CodeWriter *)
             fields_vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_900.end_idx = (string *)local_868;
        std::function<void()>::
        function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_13_,void>
                  ((function<void()> *)&local_8f0,&local_900);
        GenerateGetterOneLine((CodeWriter *)ppFVar2,&local_8a8,&local_8c8,&local_8f0);
        std::function<void_()>::~function(&local_8f0);
        std::__cxx11::string::~string((string *)&local_8c8);
        std::allocator<char>::~allocator(&local_8c9);
        std::__cxx11::string::~string((string *)&local_8a8);
        ppFVar2 = fields_vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::operator+(&local_920,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&field_type.field_2 + 8),"InByteBuffer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_940,"_bb: ByteBuffer",&local_941);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_968,"ByteBuffer",&local_969);
        nested_type_name.field_2._8_8_ =
             fields_vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::function<void()>::
        function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_14_,void>
                  ((function<void()> *)&local_990,
                   (anon_class_16_2_a89c3491 *)((long)&nested_type_name.field_2 + 8));
        GenerateFunOneLine((CodeWriter *)ppFVar2,&local_920,&local_940,&local_968,&local_990,false);
        std::function<void_()>::~function(&local_990);
        std::__cxx11::string::~string((string *)&local_968);
        std::allocator<char>::~allocator(&local_969);
        std::__cxx11::string::~string((string *)&local_940);
        std::allocator<char>::~allocator(&local_941);
        std::__cxx11::string::~string((string *)&local_920);
        std::__cxx11::string::~string((string *)local_868);
      }
      if ((this_00->namer_).super_Namer.config_.object_suffix.field_2._M_allocated_capacity != 0) {
        pDVar1 = (Definition *)
                 (this_00->namer_).super_Namer.config_.object_suffix.field_2._M_allocated_capacity;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_9e0,"",
                   (allocator<char> *)(nested_method_name.field_2._M_local_buf + 0xf));
        BaseGenerator::WrapInNameSpace
                  ((string *)local_9c0,&this->super_BaseGenerator,pDVar1,&local_9e0);
        std::__cxx11::string::~string((string *)&local_9e0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(nested_method_name.field_2._M_local_buf + 0xf));
        std::operator+(&local_a28,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&field_type.field_2 + 8),"As");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a08,&local_a28,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (this_00->namer_).super_Namer.config_.object_suffix.field_2.
                       _M_allocated_capacity);
        std::__cxx11::string::~string((string *)&local_a28);
        ppFVar2 = fields_vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::operator+(&local_a48,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_9c0,"?");
        local_a80.writer =
             (CodeWriter *)
             fields_vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_a80.nested_method_name =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a08;
        local_a80.nested_type_name = (string *)local_9c0;
        std::function<void()>::
        function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_15_,void>
                  ((function<void()> *)&local_a68,&local_a80);
        GenerateGetterOneLine((CodeWriter *)ppFVar2,(string *)local_a08,&local_a48,&local_a68);
        std::function<void_()>::~function(&local_a68);
        std::__cxx11::string::~string((string *)&local_a48);
        ppFVar2 = fields_vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::operator+(&local_aa0,"obj: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_9c0);
        std::operator+(&local_ac0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_9c0,"?");
        value_type._24_8_ =
             fields_vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::function<void()>::
        function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_16_,void>
                  ((function<void()> *)&local_ae0,
                   (anon_class_16_2_97156e7b *)&value_type.fixed_length);
        GenerateFun((CodeWriter *)ppFVar2,(string *)local_a08,&local_aa0,&local_ac0,&local_ae0,false
                   );
        std::function<void_()>::~function(&local_ae0);
        std::__cxx11::string::~string((string *)&local_ac0);
        std::__cxx11::string::~string((string *)&local_aa0);
        std::__cxx11::string::~string((string *)local_a08);
        std::__cxx11::string::~string((string *)local_9c0);
      }
      if (((((this->super_BaseGenerator).parser_)->opts).mutable_buffer & 1U) != 0) {
        underlying_type._24_8_ =
             *(undefined8 *)&(this_00->namer_).super_Namer.config_.escape_keywords;
        value_type._0_8_ = *(undefined8 *)&(this_00->namer_).super_Namer.config_.namespace_seperator
        ;
        value_type.struct_def =
             (StructDef *)(this_00->namer_).super_Namer.config_.namespace_seperator._M_string_length
        ;
        value_type.enum_def =
             *(EnumDef **)&(this_00->namer_).super_Namer.config_.namespace_seperator.field_2;
        uVar3 = underlying_type._24_8_;
        uVar4 = value_type._0_8_;
        pSVar5 = value_type.struct_def;
        pEVar6 = value_type.enum_def;
        if (local_1b4 == 0xe) {
          Type::VectorType((Type *)((long)&name_1.field_2 + 8),(Type *)&underlying_type.fixed_length
                          );
          uVar3 = name_1.field_2._8_8_;
          uVar4 = underlying_type._0_8_;
          pSVar5 = underlying_type.struct_def;
          pEVar6 = underlying_type.enum_def;
        }
        underlying_type.enum_def = pEVar6;
        underlying_type.struct_def = pSVar5;
        underlying_type._0_8_ = uVar4;
        name_1.field_2._8_8_ = uVar3;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_b70,"mutate",&local_b71)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b98,"",(allocator<char> *)(size.field_2._M_local_buf + 0xf));
        IdlNamer::LegacyKotlinMethod
                  ((string *)local_b50,&this->namer_,&local_b70,(FieldDef *)this_00,&local_b98);
        std::__cxx11::string::~string((string *)&local_b98);
        std::allocator<char>::~allocator((allocator<char> *)(size.field_2._M_local_buf + 0xf));
        std::__cxx11::string::~string((string *)&local_b70);
        std::allocator<char>::~allocator(&local_b71);
        t = InlineSize((Type *)((long)&name_1.field_2 + 8));
        NumToString<unsigned_long>((string *)((long)&params_2.field_2 + 8),t);
        IdlNamer::Field_abi_cxx11_(&local_c20,&this->namer_,(FieldDef *)this_00);
        std::operator+(&local_c00,&local_c20,": ");
        GenTypeGet_abi_cxx11_
                  ((string *)((long)&setter_parameter.field_2 + 8),this,
                   (Type *)((long)&name_1.field_2 + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_be0,&local_c00,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&setter_parameter.field_2 + 8));
        std::__cxx11::string::~string((string *)(setter_parameter.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&local_c00);
        std::__cxx11::string::~string((string *)&local_c20);
        if (local_1b4 == 0xe) {
          std::__cxx11::string::insert((ulong)local_be0,(char *)0x0);
        }
        setter_index.field_2._M_local_buf[0xf] = '\0';
        setter_index.field_2._M_local_buf[0xe] = '\0';
        if (name_1.field_2._8_4_ == 2) {
          IdlNamer::Field_abi_cxx11_(&local_ca0,&this->namer_,(FieldDef *)this_00);
          setter_index.field_2._M_local_buf[0xf] = '\x01';
          std::operator+(&local_c80,"(if(",&local_ca0);
          setter_index.field_2._M_local_buf[0xe] = '\x01';
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c60,&local_c80,") 1 else 0).toByte()");
        }
        else {
          IdlNamer::Field_abi_cxx11_((string *)local_c60,&this->namer_,(FieldDef *)this_00);
        }
        if ((setter_index.field_2._M_local_buf[0xe] & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_c80);
        }
        if ((setter_index.field_2._M_local_buf[0xf] & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_ca0);
        }
        bVar7 = false;
        if (local_1b4 == 0xe) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_cc8,"__vector(o) + j * ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&params_2.field_2 + 8));
        }
        else {
          bVar7 = (struct_def->fixed & 1U) == 0;
          if (bVar7) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_cc8,"o + bb_pos",&local_cc9);
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_cc8,"bb_pos + ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&offset_prefix.field_2 + 8));
          }
        }
        if (bVar7) {
          std::allocator<char>::~allocator(&local_cc9);
        }
        bVar7 = IsScalar(local_1b4);
        local_108a = true;
        if (!bVar7) {
          local_108b = false;
          if (local_1b4 == 0xe) {
            Type::VectorType((Type *)&statements.offset_val,(Type *)&underlying_type.fixed_length);
            local_108b = IsScalar((BaseType)statements.offset_val);
          }
          local_108a = local_108b;
        }
        ppFVar2 = fields_vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (local_108a != false) {
          local_d30 = (undefined1  [8])
                      fields_vec.
                      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
          statements.this = (KotlinGenerator *)((long)&name_1.field_2 + 8);
          statements.underlying_type = (Type *)local_cc8;
          statements.setter_index =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c60;
          statements.struct_def = (StructDef *)((long)&offset_prefix.field_2 + 8);
          statements.writer = (CodeWriter *)this;
          statements.setter_parameter =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00;
          statements.field = (FieldDef *)struct_def;
          if ((struct_def->fixed & 1U) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_d98,"Boolean",&local_d99);
            std::function<void()>::
            function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_17_&,void>
                      ((function<void()> *)&local_dc0,(anon_class_64_8_846b8abb *)local_d30);
            GenerateFun((CodeWriter *)ppFVar2,(string *)local_b50,(string *)local_be0,&local_d98,
                        &local_dc0,false);
            std::function<void_()>::~function(&local_dc0);
            std::__cxx11::string::~string((string *)&local_d98);
            std::allocator<char>::~allocator(&local_d99);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_d50,"ByteBuffer",&local_d51);
            std::function<void()>::
            function<flatbuffers::kotlin::KotlinGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_17_&,void>
                      ((function<void()> *)&local_d78,(anon_class_64_8_846b8abb *)local_d30);
            GenerateFunOneLine((CodeWriter *)ppFVar2,(string *)local_b50,(string *)local_be0,
                               &local_d50,&local_d78,false);
            std::function<void_()>::~function(&local_d78);
            std::__cxx11::string::~string((string *)&local_d50);
            std::allocator<char>::~allocator(&local_d51);
          }
        }
        std::__cxx11::string::~string((string *)local_cc8);
        std::__cxx11::string::~string((string *)local_c60);
        std::__cxx11::string::~string((string *)local_be0);
        std::__cxx11::string::~string((string *)(params_2.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_b50);
      }
      std::__cxx11::string::~string((string *)local_190);
      std::__cxx11::string::~string((string *)(offset_prefix.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(offset_val.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_108);
      std::__cxx11::string::~string((string *)(bbgetter.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(return_type.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(field_default_value.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(field_type.field_2._M_local_buf + 8));
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_48);
  } while( true );
}

Assistant:

void GenerateStructGetters(StructDef &struct_def, CodeWriter &writer) const {
    auto fields_vec = struct_def.fields.vec;
    FieldDef *key_field = nullptr;
    for (auto it = fields_vec.begin(); it != fields_vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      if (field.key) key_field = &field;

      GenerateComment(field.doc_comment, writer, &comment_config);

      auto field_name = namer_.Field(field);
      auto field_type = GenTypeGet(field.value.type);
      auto field_default_value = GenDefaultValue(field);
      auto return_type = GetterReturnType(field);
      auto bbgetter = ByteBufferGetter(field.value.type, "bb");
      auto ucast = CastToUsigned(field);
      auto offset_val = NumToString(field.value.offset);
      auto offset_prefix =
          "val o = __offset(" + offset_val + "); return o != 0 ? ";
      auto value_base_type = field.value.type.base_type;
      // Most field accessors need to retrieve and test the field offset
      // first, this is the offset value for that:
      writer.SetValue("offset", NumToString(field.value.offset));
      writer.SetValue("return_type", return_type);
      writer.SetValue("field_type", field_type);
      writer.SetValue("field_name", field_name);
      writer.SetValue("field_default", field_default_value);
      writer.SetValue("bbgetter", bbgetter);
      writer.SetValue("ucast", ucast);

      // Generate the accessors that don't do object reuse.
      if (value_base_type == BASE_TYPE_STRUCT) {
        // Calls the accessor that takes an accessor object with a
        // new object.
        // val pos
        //     get() = pos(Vec3())
        GenerateGetterOneLine(writer, field_name, return_type, [&]() {
          writer += "{{field_name}}({{field_type}}())";
        });
      } else if (value_base_type == BASE_TYPE_VECTOR &&
                 field.value.type.element == BASE_TYPE_STRUCT) {
        // Accessors for vectors of structs also take accessor objects,
        // this generates a variant without that argument.
        // ex: fun weapons(j: Int) = weapons(Weapon(), j)
        GenerateFunOneLine(writer, field_name, "j: Int", return_type, [&]() {
          writer += "{{field_name}}({{field_type}}(), j)";
        });
      }

      if (IsScalar(value_base_type)) {
        if (struct_def.fixed) {
          GenerateGetterOneLine(writer, field_name, return_type, [&]() {
            writer += "{{bbgetter}}(bb_pos + {{offset}}){{ucast}}";
          });
        } else {
          GenerateGetter(writer, field_name, return_type, [&]() {
            writer += "val o = __offset({{offset}})";
            writer +=
                "return if(o != 0) {{bbgetter}}"
                "(o + bb_pos){{ucast}} else "
                "{{field_default}}";
          });
        }
      } else {
        switch (value_base_type) {
          case BASE_TYPE_STRUCT:
            if (struct_def.fixed) {
              // create getter with object reuse
              // ex:
              // fun pos(obj: Vec3) : Vec3? = obj.__assign(bb_pos + 4, bb)
              // ? adds nullability annotation
              GenerateFunOneLine(
                  writer, field_name, "obj: " + field_type, return_type,
                  [&]() { writer += "obj.__assign(bb_pos + {{offset}}, bb)"; });
            } else {
              // create getter with object reuse
              // ex:
              //  fun pos(obj: Vec3) : Vec3? {
              //      val o = __offset(4)
              //      return if(o != 0) {
              //          obj.__assign(o + bb_pos, bb)
              //      else {
              //          null
              //      }
              //  }
              // ? adds nullability annotation
              GenerateFun(
                  writer, field_name, "obj: " + field_type, return_type, [&]() {
                    auto fixed = field.value.type.struct_def->fixed;

                    writer.SetValue("seek", Indirect("o + bb_pos", fixed));
                    OffsetWrapper(
                        writer, offset_val,
                        [&]() { writer += "obj.__assign({{seek}}, bb)"; },
                        [&]() {
                          if (field.IsRequired()) {
                            writer +=
                                "throw AssertionError(\"No value for "
                                "(required) field {{field_name}}\")";
                          } else {
                            writer += "null";
                          }
                        });
                  });
            }
            break;
          case BASE_TYPE_STRING:
            // create string getter
            // e.g.
            // val Name : String?
            //     get() = {
            //         val o = __offset(10)
            //          return if (o != 0) {
            //              __string(o + bb_pos)
            //          } else {
            //              null
            //          }
            //     }
            // ? adds nullability annotation
            GenerateGetter(writer, field_name, return_type, [&]() {
              writer += "val o = __offset({{offset}})";
              writer += "return if (o != 0) {";
              writer.IncrementIdentLevel();
              writer += "__string(o + bb_pos)";
              writer.DecrementIdentLevel();
              writer += "} else {";
              writer.IncrementIdentLevel();
              if (field.IsRequired()) {
                writer +=
                    "throw AssertionError(\"No value for (required) field "
                    "{{field_name}}\")";
              } else {
                writer += "null";
              }
              writer.DecrementIdentLevel();
              writer += "}";
            });
            break;
          case BASE_TYPE_VECTOR: {
            // e.g.
            // fun inventory(j: Int) : UByte {
            //     val o = __offset(14)
            //     return if (o != 0) {
            //         bb.get(__vector(o) + j * 1).toUByte()
            //     } else {
            //        0
            //     }
            // }

            auto vectortype = field.value.type.VectorType();
            std::string params = "j: Int";

            if (vectortype.base_type == BASE_TYPE_STRUCT ||
                vectortype.base_type == BASE_TYPE_UNION) {
              params = "obj: " + field_type + ", j: Int";
            }

            GenerateFun(writer, field_name, params, return_type, [&]() {
              auto inline_size = NumToString(InlineSize(vectortype));
              auto index = "__vector(o) + j * " + inline_size;
              auto not_found =
                  field.IsRequired()
                      ? "throw IndexOutOfBoundsException(\"Index out of range: "
                        "$j, vector {{field_name}} is empty\")"
                      : NotFoundReturn(field.value.type.element);
              auto found = "";
              writer.SetValue("index", index);
              switch (vectortype.base_type) {
                case BASE_TYPE_STRUCT: {
                  bool fixed = vectortype.struct_def->fixed;
                  writer.SetValue("index", Indirect(index, fixed));
                  found = "obj.__assign({{index}}, bb)";
                  break;
                }
                case BASE_TYPE_UNION:
                  found = "{{bbgetter}}(obj, {{index}}){{ucast}}";
                  break;
                default: found = "{{bbgetter}}({{index}}){{ucast}}";
              }
              OffsetWrapper(
                  writer, offset_val, [&]() { writer += found; },
                  [&]() { writer += not_found; });
            });
            break;
          }
          case BASE_TYPE_UNION:
            GenerateFun(
                writer, field_name, "obj: " + field_type, return_type, [&]() {
                  writer += OffsetWrapperOneLine(
                      offset_val, bbgetter + "(obj, o + bb_pos)", "null");
                });
            break;
          default: FLATBUFFERS_ASSERT(0);
        }
      }

      if (value_base_type == BASE_TYPE_VECTOR) {
        // Generate Lenght functions for vectors
        GenerateGetter(writer, field_name + "Length", "Int", [&]() {
          writer += OffsetWrapperOneLine(offset_val, "__vector_len(o)", "0");
        });

        // See if we should generate a by-key accessor.
        if (field.value.type.element == BASE_TYPE_STRUCT &&
            !field.value.type.struct_def->fixed) {
          auto &sd = *field.value.type.struct_def;
          auto &fields = sd.fields.vec;
          for (auto kit = fields.begin(); kit != fields.end(); ++kit) {
            auto &kfield = **kit;
            if (kfield.key) {
              auto qualified_name = WrapInNameSpace(sd);
              auto name = namer_.Method(field, "ByKey");
              auto params = "key: " + GenTypeGet(kfield.value.type);
              auto rtype = qualified_name + "?";
              GenerateFun(writer, name, params, rtype, [&]() {
                OffsetWrapper(
                    writer, offset_val,
                    [&]() {
                      writer += qualified_name +
                                ".__lookup_by_key(null, __vector(o), key, bb)";
                    },
                    [&]() { writer += "null"; });
              });

              auto param2 = "obj: " + qualified_name +
                            ", key: " + GenTypeGet(kfield.value.type);
              GenerateFun(writer, name, param2, rtype, [&]() {
                OffsetWrapper(
                    writer, offset_val,
                    [&]() {
                      writer += qualified_name +
                                ".__lookup_by_key(obj, __vector(o), key, bb)";
                    },
                    [&]() { writer += "null"; });
              });

              break;
            }
          }
        }
      }

      if ((value_base_type == BASE_TYPE_VECTOR &&
           IsScalar(field.value.type.VectorType().base_type)) ||
          value_base_type == BASE_TYPE_STRING) {
        auto end_idx =
            NumToString(value_base_type == BASE_TYPE_STRING
                            ? 1
                            : InlineSize(field.value.type.VectorType()));
        // Generate a ByteBuffer accessor for strings & vectors of scalars.
        // e.g.
        // val inventoryByteBuffer: ByteBuffer
        //     get =  __vector_as_bytebuffer(14, 1)

        GenerateGetterOneLine(
            writer, field_name + "AsByteBuffer", "ByteBuffer", [&]() {
              writer.SetValue("end", end_idx);
              writer += "__vector_as_bytebuffer({{offset}}, {{end}})";
            });

        // Generate a ByteBuffer accessor for strings & vectors of scalars.
        // e.g.
        // fun inventoryInByteBuffer(_bb: Bytebuffer):
        //     ByteBuffer = __vector_as_bytebuffer(_bb, 14, 1)
        GenerateFunOneLine(
            writer, field_name + "InByteBuffer", "_bb: ByteBuffer",
            "ByteBuffer", [&]() {
              writer.SetValue("end", end_idx);
              writer += "__vector_in_bytebuffer(_bb, {{offset}}, {{end}})";
            });
      }

      // generate object accessors if is nested_flatbuffer
      // fun testnestedflatbufferAsMonster() : Monster?
      //{ return testnestedflatbufferAsMonster(new Monster()); }

      if (field.nested_flatbuffer) {
        auto nested_type_name = WrapInNameSpace(*field.nested_flatbuffer);
        auto nested_method_name =
            field_name + "As" + field.nested_flatbuffer->name;

        GenerateGetterOneLine(
            writer, nested_method_name, nested_type_name + "?", [&]() {
              writer += nested_method_name + "(" + nested_type_name + "())";
            });

        GenerateFun(writer, nested_method_name, "obj: " + nested_type_name,
                    nested_type_name + "?", [&]() {
                      OffsetWrapper(
                          writer, offset_val,
                          [&]() {
                            writer +=
                                "obj.__assign(__indirect(__vector(o)), bb)";
                          },
                          [&]() { writer += "null"; });
                    });
      }

      // Generate mutators for scalar fields or vectors of scalars.
      if (parser_.opts.mutable_buffer) {
        auto value_type = field.value.type;
        auto underlying_type = value_base_type == BASE_TYPE_VECTOR
                                   ? value_type.VectorType()
                                   : value_type;
        auto name = namer_.LegacyKotlinMethod("mutate", field, "");
        auto size = NumToString(InlineSize(underlying_type));
        auto params = namer_.Field(field) + ": " + GenTypeGet(underlying_type);
        // A vector mutator also needs the index of the vector element it should
        // mutate.
        if (value_base_type == BASE_TYPE_VECTOR) params.insert(0, "j: Int, ");

        // Boolean parameters have to be explicitly converted to byte
        // representation.
        auto setter_parameter =
            underlying_type.base_type == BASE_TYPE_BOOL
                ? "(if(" + namer_.Field(field) + ") 1 else 0).toByte()"
                : namer_.Field(field);

        auto setter_index =
            value_base_type == BASE_TYPE_VECTOR
                ? "__vector(o) + j * " + size
                : (struct_def.fixed ? "bb_pos + " + offset_val : "o + bb_pos");
        if (IsScalar(value_base_type) ||
            (value_base_type == BASE_TYPE_VECTOR &&
             IsScalar(value_type.VectorType().base_type))) {
          auto statements = [&]() {
            writer.SetValue("bbsetter", ByteBufferSetter(underlying_type));
            writer.SetValue("index", setter_index);
            writer.SetValue("params", setter_parameter);
            writer.SetValue("cast", CastToSigned(field));
            if (struct_def.fixed) {
              writer += "{{bbsetter}}({{index}}, {{params}}{{cast}})";
            } else {
              OffsetWrapper(
                  writer, offset_val,
                  [&]() {
                    writer += "{{bbsetter}}({{index}}, {{params}}{{cast}})";
                    writer += "true";
                  },
                  [&]() { writer += "false"; });
            }
          };

          if (struct_def.fixed) {
            GenerateFunOneLine(writer, name, params, "ByteBuffer", statements);
          } else {
            GenerateFun(writer, name, params, "Boolean", statements);
          }
        }
      }
    }
    if (struct_def.has_key && !struct_def.fixed) {
      // Key Comparison method
      GenerateOverrideFun(
          writer, "keysCompare", "o1: Int, o2: Int, _bb: ByteBuffer", "Int",
          [&]() {
            if (IsString(key_field->value.type)) {
              writer.SetValue("offset", NumToString(key_field->value.offset));
              writer +=
                  " return compareStrings(__offset({{offset}}, o1, "
                  "_bb), __offset({{offset}}, o2, _bb), _bb)";

            } else {
              auto getter1 = GenLookupByKey(key_field, "_bb", "o1");
              auto getter2 = GenLookupByKey(key_field, "_bb", "o2");
              writer += "val val_1 = " + getter1;
              writer += "val val_2 = " + getter2;
              writer += "return (val_1 - val_2).sign";
            }
          });
    }
  }